

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O2

void bloaty::macho::ParseLoadCommand(LoadCommand *cmd,RangeSink *sink)

{
  uint32_t uVar1;
  dysymtab_command *pdVar2;
  size_t sVar3;
  dyld_info_command *pdVar4;
  size_t sVar5;
  symtab_command *psVar6;
  char *pcVar7;
  char *in_RDX;
  char *analyzer;
  size_t in_R8;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  string_view data_03;
  string_view data_04;
  string_view data_05;
  string_view data_06;
  string_view data_07;
  string_view data_08;
  string_view data_09;
  string_view data_10;
  string_view data_11;
  string_view data_12;
  string_view data_13;
  string_view sVar8;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view label;
  size_t sStackY_60;
  
  uVar1 = cmd->cmd;
  switch(uVar1) {
  case 0x19:
    ParseSegment<segment_command_64,section_64>(*cmd,sink);
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x20:
  case 0x21:
switchD_0018ea3d_caseD_27:
    return;
  case 0x1d:
    pcVar7 = "Code Signature";
    sStackY_60 = 0xe;
    break;
  case 0x1e:
    pcVar7 = "Segment Split Info";
LAB_0018ed1b:
    sStackY_60 = 0x12;
    break;
  case 0x22:
switchD_0018ea5b_caseD_22:
    data_05._M_str = in_RDX;
    data_05._M_len = (size_t)(cmd->command_data)._M_str;
    pdVar4 = GetStructPointer<dyld_info_command>((macho *)(cmd->command_data)._M_len,data_05);
    data_06._M_str._0_4_ = pdVar4->rebase_off;
    data_06._M_len = (size_t)(cmd->file_data)._M_str;
    data_06._M_str._4_4_ = 0;
    sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_06,(ulong)pdVar4->rebase_size,in_R8)
    ;
    sVar5 = sVar8._M_len;
    analyzer = "macho_dyld";
    sVar3 = 0xb;
    name_04._M_str = "Rebase Info";
    name_04._M_len = 0xb;
    RangeSink::AddFileRange(sink,"macho_dyld",name_04,sVar8);
    data_07._M_str._0_4_ = pdVar4->bind_off;
    data_07._M_len = (size_t)(cmd->file_data)._M_str;
    data_07._M_str._4_4_ = 0;
    sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_07,(ulong)pdVar4->bind_size,sVar5);
    sVar5 = sVar8._M_len;
    name_05._M_str = "Binding Info";
    name_05._M_len = 0xc;
    RangeSink::AddFileRange(sink,"macho_dyld",name_05,sVar8);
    data_08._M_str._0_4_ = pdVar4->weak_bind_off;
    data_08._M_len = (size_t)(cmd->file_data)._M_str;
    data_08._M_str._4_4_ = 0;
    sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_08,(ulong)pdVar4->weak_bind_size,
                         sVar5);
    sVar5 = sVar8._M_len;
    name_06._M_str = "Weak Binding Info";
    name_06._M_len = 0x11;
    RangeSink::AddFileRange(sink,"macho_dyld",name_06,sVar8);
    data_09._M_str._0_4_ = pdVar4->lazy_bind_off;
    data_09._M_len = (size_t)(cmd->file_data)._M_str;
    data_09._M_str._4_4_ = 0;
    sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_09,(ulong)pdVar4->lazy_bind_size,
                         sVar5);
    sVar5 = sVar8._M_len;
    name_07._M_str = "Lazy Binding Info";
    name_07._M_len = 0x11;
    RangeSink::AddFileRange(sink,"macho_dyld",name_07,sVar8);
    data_10._M_str._0_4_ = pdVar4->export_off;
    data_10._M_len = (size_t)(cmd->file_data)._M_str;
    data_10._M_str._4_4_ = 0;
    sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_10,(ulong)pdVar4->export_size,sVar5)
    ;
    pcVar7 = "Export Info";
LAB_0018edf7:
    name_09._M_str = pcVar7;
    name_09._M_len = sVar3;
    RangeSink::AddFileRange(sink,analyzer,name_09,sVar8);
    return;
  default:
    switch(uVar1) {
    case 0x26:
      pcVar7 = "Function Start Addresses";
      sStackY_60 = 0x18;
      break;
    case 0x27:
    case 0x28:
    case 0x2a:
    case 0x2c:
    case 0x2d:
      goto switchD_0018ea3d_caseD_27;
    case 0x29:
      pcVar7 = "Table of Non-instructions";
      sStackY_60 = 0x19;
      break;
    case 0x2b:
      pcVar7 = "Code Signing DRs";
      sStackY_60 = 0x10;
      break;
    case 0x2e:
      pcVar7 = "Optimization Hints";
      goto LAB_0018ed1b;
    default:
      if (uVar1 != 0x80000022) {
        if (uVar1 == 1) {
          ParseSegment<segment_command,section>(*cmd,sink);
          return;
        }
        if (uVar1 == 2) {
          data_11._M_str = in_RDX;
          data_11._M_len = (size_t)(cmd->command_data)._M_str;
          psVar6 = GetStructPointer<symtab_command>((macho *)(cmd->command_data)._M_len,data_11);
          data_12._M_str._0_4_ = psVar6->symoff;
          data_12._M_len = (size_t)(cmd->file_data)._M_str;
          data_12._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_12,
                               (ulong)psVar6->nsyms * ((ulong)cmd->is64bit * 4 + 0xc),in_R8);
          sVar5 = sVar8._M_len;
          analyzer = "macho_symtab";
          sVar3 = 0xc;
          name_08._M_str = "Symbol Table";
          name_08._M_len = 0xc;
          RangeSink::AddFileRange(sink,"macho_symtab",name_08,sVar8);
          data_13._M_str._0_4_ = psVar6->stroff;
          data_13._M_len = (size_t)(cmd->file_data)._M_str;
          data_13._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_13,(ulong)psVar6->strsize,
                               sVar5);
          pcVar7 = "String Table";
        }
        else {
          if (uVar1 != 0xb) {
            return;
          }
          sVar8._M_str = in_RDX;
          sVar8._M_len = (size_t)(cmd->command_data)._M_str;
          pdVar2 = GetStructPointer<dysymtab_command>((macho *)(cmd->command_data)._M_len,sVar8);
          data._M_str._0_4_ = pdVar2->tocoff;
          data._M_len = (size_t)(cmd->file_data)._M_str;
          data._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data,(ulong)pdVar2->ntoc << 3,in_R8
                              );
          sVar3 = sVar8._M_len;
          name._M_str = "Table of Contents";
          name._M_len = 0x11;
          RangeSink::AddFileRange(sink,"macho_dynsymtab",name,sVar8);
          data_00._M_str._0_4_ = pdVar2->modtaboff;
          data_00._M_len = (size_t)(cmd->file_data)._M_str;
          data_00._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_00,
                               (ulong)pdVar2->nmodtab * 0x38,sVar3);
          sVar3 = sVar8._M_len;
          name_00._M_str = "Module Table";
          name_00._M_len = 0xc;
          RangeSink::AddFileRange(sink,"macho_dynsymtab",name_00,sVar8);
          data_01._M_str._0_4_ = pdVar2->extrefsymoff;
          data_01._M_len = (size_t)(cmd->file_data)._M_str;
          data_01._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_01,
                               (ulong)pdVar2->nextrefsyms << 2,sVar3);
          sVar3 = sVar8._M_len;
          name_01._M_str = "Referenced Symbol Table";
          name_01._M_len = 0x17;
          RangeSink::AddFileRange(sink,"macho_dynsymtab",name_01,sVar8);
          data_02._M_str._0_4_ = pdVar2->indirectsymoff;
          data_02._M_len = (size_t)(cmd->file_data)._M_str;
          data_02._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_02,
                               (ulong)pdVar2->nindirectsyms << 2,sVar3);
          sVar3 = sVar8._M_len;
          name_02._M_str = "Indirect Symbol Table";
          name_02._M_len = 0x15;
          RangeSink::AddFileRange(sink,"macho_dynsymtab",name_02,sVar8);
          data_03._M_str._0_4_ = pdVar2->extreloff;
          data_03._M_len = (size_t)(cmd->file_data)._M_str;
          data_03._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_03,(ulong)pdVar2->nextrel << 3
                               ,sVar3);
          sVar3 = sVar8._M_len;
          name_03._M_str = "External Relocation Entries";
          name_03._M_len = 0x1b;
          RangeSink::AddFileRange(sink,"macho_dynsymtab",name_03,sVar8);
          data_04._M_str._0_4_ = pdVar2->locreloff;
          data_04._M_len = (size_t)(cmd->file_data)._M_str;
          data_04._M_str._4_4_ = 0;
          sVar8 = StrictSubstr((bloaty *)(cmd->file_data)._M_len,data_04,(ulong)pdVar2->nlocrel << 3
                               ,sVar3);
          pcVar7 = "Local Relocation Entries";
          sVar3 = 0x18;
          analyzer = "macho_dynsymtab";
        }
        goto LAB_0018edf7;
      }
      goto switchD_0018ea5b_caseD_22;
    }
  }
  label._M_str = pcVar7;
  label._M_len = sStackY_60;
  ParseLinkeditCommand(label,cmd,sink);
  return;
}

Assistant:

void ParseLoadCommand(const LoadCommand& cmd, RangeSink* sink) {
  switch (cmd.cmd) {
    case LC_SEGMENT_64:
      ParseSegment<segment_command_64, section_64>(cmd, sink);
      break;
    case LC_SEGMENT:
      ParseSegment<segment_command, section>(cmd, sink);
      break;
    case LC_DYLD_INFO:
    case LC_DYLD_INFO_ONLY:
      ParseDyldInfo(cmd, sink);
      break;
    case LC_SYMTAB:
      ParseSymbolTable(cmd, sink);
      break;
    case LC_DYSYMTAB:
      ParseDynamicSymbolTable(cmd, sink);
      break;
    case LC_CODE_SIGNATURE:
      ParseLinkeditCommand("Code Signature", cmd, sink);
      break;
    case LC_SEGMENT_SPLIT_INFO:
      ParseLinkeditCommand("Segment Split Info", cmd, sink);
      break;
    case LC_FUNCTION_STARTS:
      ParseLinkeditCommand("Function Start Addresses", cmd, sink);
      break;
    case LC_DATA_IN_CODE:
      ParseLinkeditCommand("Table of Non-instructions", cmd, sink);
      break;
    case LC_DYLIB_CODE_SIGN_DRS:
      ParseLinkeditCommand("Code Signing DRs", cmd, sink);
      break;
    case LC_LINKER_OPTIMIZATION_HINT:
      ParseLinkeditCommand("Optimization Hints", cmd, sink);
      break;
  }
}